

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_array.h
# Opt level: O3

void __thiscall
webrtc::AlignedArray<std::complex<float>_>::AlignedArray
          (AlignedArray<std::complex<float>_> *this,size_t rows,size_t cols,size_t alignment)

{
  string *result;
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  ulong uVar3;
  size_t local_190;
  FatalMessage local_188;
  
  this->rows_ = rows;
  this->cols_ = cols;
  local_188.stream_ = (ostringstream)0x0;
  local_188._1_3_ = 0;
  local_190 = alignment;
  if (alignment == 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (&local_190,(uint *)&local_188,"alignment > 0u");
    if (result != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/system_wrappers/include/aligned_array.h"
                 ,0x1a,result);
      rtc::FatalMessage::~FatalMessage(&local_188);
    }
    rows = this->rows_;
  }
  ppcVar1 = (complex<float> **)AlignedMalloc(rows << 3,local_190);
  this->head_row_ = ppcVar1;
  if (this->rows_ != 0) {
    uVar3 = 0;
    do {
      pcVar2 = (complex<float> *)AlignedMalloc(this->cols_ << 3,local_190);
      this->head_row_[uVar3] = pcVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->rows_);
  }
  return;
}

Assistant:

AlignedArray(size_t rows, size_t cols, size_t alignment)
      : rows_(rows),
        cols_(cols) {
    RTC_CHECK_GT(alignment, 0u);
    head_row_ = static_cast<T**>(AlignedMalloc(rows_ * sizeof(*head_row_),
                                               alignment));
    for (size_t i = 0; i < rows_; ++i) {
      head_row_[i] = static_cast<T*>(AlignedMalloc(cols_ * sizeof(**head_row_),
                                                   alignment));
    }
  }